

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager.cc
# Opt level: O0

int filesystem::copy(path *from,path *to)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined8 extraout_RAX;
  streambuf *psVar3;
  path local_490;
  undefined1 local_470 [8];
  ofstream dst;
  string local_270 [32];
  undefined1 local_250 [8];
  ifstream src;
  path local_38;
  path *local_18;
  path *to_local;
  path *from_local;
  
  local_18 = to;
  to_local = from;
  bVar1 = exists(from);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    bVar1 = exists(local_18);
    iVar2 = (int)CONCAT71(extraout_var_00,bVar1);
    if (!bVar1) {
      path::parent_path(&local_38,local_18);
      bVar1 = create_directories(&local_38);
      path::~path(&local_38);
      iVar2 = (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),bVar1);
      if (bVar1) {
        path::string_abi_cxx11_((path *)local_270);
        std::ifstream::ifstream(local_250,local_270,_S_in);
        std::__cxx11::string::~string(local_270);
        path::string_abi_cxx11_(&local_490);
        std::ofstream::ofstream(local_470,(string *)&local_490,_S_out);
        std::__cxx11::string::~string((string *)&local_490);
        psVar3 = (streambuf *)std::ifstream::rdbuf();
        std::ostream::operator<<(local_470,psVar3);
        std::ofstream::~ofstream(local_470);
        iVar2 = std::ifstream::~ifstream(local_250);
      }
    }
  }
  return iVar2;
}

Assistant:

void ::filesystem::copy(const path& from, const path& to)
{
    if (!::filesystem::exists(from)) {
        return;
    }

    if (!::filesystem::exists(to)) {
        if (::filesystem::create_directories(to.parent_path())) {
            ifstream src(from.string());
            ofstream dst(to.string());

            dst << src.rdbuf();
        }
    }
}